

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastZ32S1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ParseContext *pPVar1;
  byte *pbVar2;
  MessageLite *pMVar3;
  uint64_t uVar4;
  TcParseTableBase *this;
  uchar uVar5;
  byte bVar6;
  bool bVar7;
  uint16_t uVar8;
  unsigned_short uVar9;
  int32_t iVar10;
  uint uVar11;
  char *pcVar12;
  int *piVar13;
  uint *puVar14;
  ulong uVar15;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_130;
  uint64_t local_128;
  TcParseTableBase *local_120;
  ParseContext *local_118;
  byte *local_110;
  MessageLite *local_108;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_100;
  TcFieldData local_f8;
  TcFieldData local_f0;
  undefined1 local_e1;
  ulong uStack_e0;
  bool always_return;
  TcParseTableBase *local_d8;
  ParseContext *local_d0;
  byte *local_c8;
  MessageLite *local_c0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_b8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_b0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_a8;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  uint32_t has_bits_offset;
  
  local_128 = hasbits;
  local_120 = table;
  local_118 = ctx;
  local_110 = (byte *)ptr;
  local_108 = msg;
  local_100 = data.field_0;
  uVar5 = TcFieldData::coded_tag<unsigned_char>((TcFieldData *)&local_100);
  pMVar3 = local_108;
  pbVar2 = local_110;
  pPVar1 = local_118;
  if (uVar5 != '\0') {
    TcFieldData::TcFieldData((TcFieldData *)&local_130);
    pcVar12 = MiniParse(pMVar3,(char *)pbVar2,pPVar1,(TcFieldData)local_130,local_120,local_128);
    return pcVar12;
  }
  local_110 = local_110 + 1;
  bVar6 = TcFieldData::hasbit_idx((TcFieldData *)&local_100);
  local_128 = 1L << (bVar6 & 0x3f) | local_128;
  if ((char)*local_110 < '\0') {
    pcVar12 = SingularVarBigint<int,unsigned_char,true>
                        (local_108,(char *)local_110,local_118,(TcFieldData)local_100,local_120,
                         local_128);
    return pcVar12;
  }
  bVar6 = *local_110;
  local_110 = local_110 + 1;
  iVar10 = (anonymous_namespace)::ZigZagDecodeHelper<int,true>((uint)bVar6);
  pMVar3 = local_108;
  uVar8 = TcFieldData::offset((TcFieldData *)&local_100);
  piVar13 = RefAt<int>(pMVar3,(ulong)uVar8);
  pMVar3 = local_108;
  pbVar2 = local_110;
  pPVar1 = local_118;
  *piVar13 = iVar10;
  TcFieldData::TcFieldData(&data_local);
  local_b8 = data_local.field_0;
  local_c0 = pMVar3;
  local_c8 = pbVar2;
  local_d0 = pPVar1;
  local_d8 = local_120;
  uStack_e0 = local_128;
  local_e1 = 0;
  bVar7 = EpsCopyInputStream::DataAvailable(&pPVar1->super_EpsCopyInputStream,(char *)pbVar2);
  pMVar3 = local_c0;
  pbVar2 = local_c8;
  pPVar1 = local_d0;
  if (!bVar7) {
    TcFieldData::TcFieldData(&local_f0);
    if (local_d8->has_bits_offset != 0) {
      uVar11 = (uint)uStack_e0;
      puVar14 = RefAt<unsigned_int>(pMVar3,(ulong)(uint)local_d8->has_bits_offset);
      *puVar14 = uVar11 | *puVar14;
    }
    return (char *)pbVar2;
  }
  TcFieldData::TcFieldData(&local_f8);
  this = local_d8;
  uVar4 = uStack_e0;
  uVar9 = UnalignedLoad<unsigned_short>((char *)pbVar2);
  uVar15 = (ulong)(int)((uint)uVar9 & (uint)this->fast_idx_mask);
  if ((uVar15 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  data_1.field_0 =
       (anon_union_8_1_898a9ca8_for_TcFieldData_0)TcParseTableBase::fast_entry(this,uVar15 >> 3);
  local_a8.data =
       ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
       (ulong)uVar9;
  UNRECOVERED_JUMPTABLE = TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0)
  ;
  local_b0.data = local_a8.data;
  pcVar12 = (*UNRECOVERED_JUMPTABLE)(pMVar3,(char *)pbVar2,pPVar1,(TcFieldData)local_a8,this,uVar4);
  return pcVar12;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastZ32S1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularVarint<int32_t, uint8_t, true>(
      PROTOBUF_TC_PARAM_PASS);
}